

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

Segment * reflection(Segment *__return_storage_ptr__,Segment *segment,Plane *plane)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  Point PVar8;
  
  PVar8 = operator-(segment->b,&segment->a);
  uVar3 = (plane->normal).x;
  uVar5 = (plane->normal).y;
  fVar1 = (plane->normal).z;
  fVar7 = PVar8.z * fVar1 + PVar8.x * (float)uVar3 + PVar8.y * (float)uVar5;
  fVar7 = fVar7 + fVar7;
  (__return_storage_ptr__->a).z = (segment->b).z;
  fVar2 = (segment->b).y;
  (__return_storage_ptr__->a).x = (segment->b).x;
  (__return_storage_ptr__->a).y = fVar2;
  uVar4 = (segment->b).x;
  uVar6 = (segment->b).y;
  fVar2 = (segment->b).z;
  (__return_storage_ptr__->b).x = (PVar8.x - (float)uVar3 * fVar7) + (float)uVar4;
  (__return_storage_ptr__->b).y = (float)uVar6 + (PVar8.y - (float)uVar5 * fVar7);
  (__return_storage_ptr__->b).z = (PVar8.z - fVar7 * fVar1) + fVar2;
  return __return_storage_ptr__;
}

Assistant:

Segment reflection(Segment const& segment, Plane const& plane)
{
  Vector ri = segment.b - segment.a;
  ri -= plane.normal * (2 * dotProduct(ri, plane.normal));
  return {segment.b, segment.b + ri};
}